

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.h
# Opt level: O1

void __thiscall
CGL::GLScene::DirectionalLight::DirectionalLight
          (DirectionalLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  ostream *poVar4;
  long *plVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_88;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_68;
  Vector4D local_48;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_002a5878;
  (this->spectrum).field_0.field_0.x = 0.0;
  (this->spectrum).field_0.field_0.y = 0.0;
  (this->spectrum).field_0.field_0.z = 0.0;
  (this->direction).field_0.field_0.x = 0.0;
  (this->direction).field_0.field_0.y = 0.0;
  (this->direction).field_0.field_0.z = 0.0;
  (this->position).field_0.field_0.x = 0.0;
  (this->position).field_0.field_0.y = 0.0;
  (this->position).field_0.field_0.z = 0.0;
  dVar6 = (light_info->spectrum).field_0.field_0.y;
  dVar1 = (light_info->spectrum).field_0.field_0.z;
  uVar3 = *(undefined8 *)((long)&(light_info->spectrum).field_0 + 0x18);
  (this->spectrum).field_0.field_0.x = (light_info->spectrum).field_0.field_0.x;
  (this->spectrum).field_0.field_0.y = dVar6;
  (this->spectrum).field_0.field_0.z = dVar1;
  *(undefined8 *)((long)&(this->spectrum).field_0 + 0x18) = uVar3;
  local_68.field_0.x = (light_info->direction).field_0.field_0.x;
  local_68.field_0.y = (light_info->direction).field_0.field_0.y;
  local_68.field_0.z = (light_info->direction).field_0.field_0.z;
  local_68.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_68.field_0);
  Vector4D::to3D(&local_48);
  auVar7._8_4_ = 0;
  auVar7._0_8_ = -local_88.field_0.z;
  auVar7._12_4_ = 0x80000000;
  *(undefined4 *)&(this->position).field_0 = local_88._0_4_;
  *(uint *)((long)&(this->position).field_0 + 4) = local_88._4_4_ ^ 0x80000000;
  *(undefined4 *)((long)&(this->position).field_0 + 8) = local_88._8_4_;
  *(uint *)((long)&(this->position).field_0 + 0xc) = local_88._12_4_ ^ 0x80000000;
  dVar6 = (double)vmovlps_avx(auVar7);
  (this->position).field_0.field_0.z = dVar6;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"found directional light with position ",0x26);
  auVar8._0_8_ = -(this->position).field_0.field_0.z;
  auVar8._8_4_ = 0;
  auVar8._12_4_ = 0x80000000;
  local_88._0_4_ = *(undefined4 *)&(this->position).field_0;
  local_88._8_4_ = *(undefined4 *)((long)&(this->position).field_0 + 8);
  local_88._4_4_ = *(uint *)((long)&(this->position).field_0 + 4) ^ 0x80000000;
  local_88._12_4_ = *(uint *)((long)&(this->position).field_0 + 0xc) ^ 0x80000000;
  local_88.field_0.z = (double)vmovlps_avx(auVar8);
  poVar4 = (ostream *)CGL::operator<<((ostream *)&std::cout,(Vector3D *)&local_88.field_0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," and spec ",10);
  plVar5 = (long *)CGL::operator<<(poVar4,&this->spectrum);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  auVar7 = *(undefined1 (*) [16])(this->position).field_0.field_2.__vec;
  auVar7 = vdppd_avx(auVar7,auVar7,0x31);
  dVar6 = (this->position).field_0.field_0.z;
  dVar6 = dVar6 * dVar6 + auVar7._0_8_;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar6;
    auVar7 = vsqrtsd_avx(auVar9,auVar9);
    dVar6 = auVar7._0_8_;
  }
  dVar6 = 1.0 / dVar6;
  dVar1 = (this->position).field_0.field_0.z;
  dVar2 = (this->position).field_0.field_0.y;
  (this->direction).field_0.field_0.x = dVar6 * (this->position).field_0.field_0.x;
  (this->direction).field_0.field_0.y = dVar6 * dVar2;
  (this->direction).field_0.field_0.z = dVar6 * dVar1;
  return;
}

Assistant:

DirectionalLight(const Collada::LightInfo& light_info, 
                   const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
//    this->direction = -(transform * Vector4D(light_info.direction, 1)).to3D();
//    this->direction.normalize();
    // Begin -- Lens Flare
    this->position = -(transform * Vector4D(light_info.direction, 1)).to3D();
    std::cout << "found directional light with position " << -this->position << " and spec " << this->spectrum << std::endl;
    this->direction = (this->position).unit();
    // End -- Lens Flare

  }